

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cc
# Opt level: O0

void __thiscall leveldb::Options::Options(Options *this)

{
  Comparator *pCVar1;
  Env *pEVar2;
  undefined8 *in_RDI;
  
  pCVar1 = BytewiseComparator();
  *in_RDI = pCVar1;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  *(undefined1 *)((long)in_RDI + 10) = 0;
  pEVar2 = Env::Default();
  in_RDI[2] = pEVar2;
  in_RDI[3] = 0;
  in_RDI[4] = 0x400000;
  *(undefined4 *)(in_RDI + 5) = 1000;
  in_RDI[6] = 0;
  in_RDI[7] = 0x1000;
  *(undefined4 *)(in_RDI + 8) = 0x10;
  in_RDI[9] = 0x200000;
  *(undefined1 *)(in_RDI + 0x10a) = 0;
  in_RDI[0x10b] = 0;
  memset(in_RDI + 10,0,0x800);
  return;
}

Assistant:

Options::Options() : comparator(BytewiseComparator()), env(Env::Default()) {
	::memset(compressors, 0, sizeof(compressors));
}